

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# masked_variance_intrin_ssse3.c
# Opt level: O2

uint aom_masked_sub_pixel_variance16x64_ssse3
               (uint8_t *src,int src_stride,int xoffset,int yoffset,uint8_t *ref,int ref_stride,
               uint8_t *second_pred,uint8_t *msk,int msk_stride,int invert_mask,uint *sse)

{
  uint8_t *a_ptr;
  int sum;
  uint8_t temp [1040];
  
  bilinear_filter(src,src_stride,xoffset,yoffset,temp,0x10,0x40);
  if (invert_mask == 0) {
    a_ptr = temp;
  }
  else {
    a_ptr = second_pred;
    second_pred = temp;
  }
  masked_variance(ref,ref_stride,a_ptr,0x10,second_pred,0x10,msk,msk_stride,0x10,0x40,sse,&sum);
  return *sse - (int)((ulong)((long)sum * (long)sum) >> 10);
}

Assistant:

static inline __m128i filter_block(const __m128i a, const __m128i b,
                                   const __m128i filter) {
  __m128i v0 = _mm_unpacklo_epi8(a, b);
  v0 = _mm_maddubs_epi16(v0, filter);
  v0 = xx_roundn_epu16(v0, FILTER_BITS);

  __m128i v1 = _mm_unpackhi_epi8(a, b);
  v1 = _mm_maddubs_epi16(v1, filter);
  v1 = xx_roundn_epu16(v1, FILTER_BITS);

  return _mm_packus_epi16(v0, v1);
}